

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O1

void __thiscall vw_ostream::vw_streambuf::sync(vw_streambuf *this)

{
  undefined8 uVar1;
  code *pcVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = *(undefined8 *)&(this->parent->super_ostream).field_0x78;
  pcVar2 = *(code **)&(this->parent->super_ostream).field_0x80;
  std::__cxx11::stringbuf::str();
  (*pcVar2)(uVar1,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  std::__cxx11::stringbuf::str((string *)this);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

int vw_ostream::vw_streambuf::sync()
{
  int ret = std::stringbuf::sync();
  if (ret)
    return ret;

  parent.trace_listener(parent.trace_context, str());
  str("");
  return 0;  // success
}